

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_StArrWasm<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar7;
  uint64 index_00;
  WebAssemblyMemory *pWVar8;
  ArrayBufferBase *pAVar9;
  undefined4 extraout_var;
  int64 iVar11;
  float fVar12;
  double dVar13;
  BYTE *buffer;
  uint32 byteLength;
  ArrayBufferBase *arr;
  uint64 index;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  long lVar10;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23aa,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar1 = playout->Offset;
  uVar4 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  index_00 = (ulong)uVar1 + (ulong)uVar4;
  pWVar8 = GetWebAssemblyMemory(this);
  pAVar9 = WebAssemblyMemory::GetBuffer(pWVar8);
  uVar5 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  iVar6 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  lVar10 = CONCAT44(extraout_var,iVar6);
  switch(playout->ViewType) {
  case TYPE_INT8:
    WasmArrayBoundsCheck<char>(this,index_00,uVar5);
    iVar6 = GetRegRaw<int>(this,playout->Value);
    *(char *)(lVar10 + index_00) = (char)iVar6;
    break;
  case TYPE_UINT8:
    WasmArrayBoundsCheck<unsigned_char>(this,index_00,uVar5);
    iVar6 = GetRegRaw<int>(this,playout->Value);
    *(char *)(lVar10 + index_00) = (char)iVar6;
    break;
  case TYPE_INT16:
    WasmArrayBoundsCheck<short>(this,index_00,uVar5);
    iVar6 = GetRegRaw<int>(this,playout->Value);
    *(short *)(lVar10 + index_00) = (short)iVar6;
    break;
  case TYPE_UINT16:
    WasmArrayBoundsCheck<unsigned_short>(this,index_00,uVar5);
    iVar6 = GetRegRaw<int>(this,playout->Value);
    *(short *)(lVar10 + index_00) = (short)iVar6;
    break;
  case TYPE_INT32:
    WasmArrayBoundsCheck<int>(this,index_00,uVar5);
    iVar6 = GetRegRaw<int>(this,playout->Value);
    *(int *)(lVar10 + index_00) = iVar6;
    break;
  case TYPE_UINT32:
    WasmArrayBoundsCheck<unsigned_int>(this,index_00,uVar5);
    iVar6 = GetRegRaw<int>(this,playout->Value);
    *(int *)(lVar10 + index_00) = iVar6;
    break;
  case TYPE_FLOAT32:
    WasmArrayBoundsCheck<float>(this,index_00,uVar5);
    fVar12 = GetRegRaw<float>(this,playout->Value);
    *(float *)(lVar10 + index_00) = fVar12;
    break;
  case TYPE_FLOAT64:
    WasmArrayBoundsCheck<double>(this,index_00,uVar5);
    dVar13 = GetRegRaw<double>(this,playout->Value);
    *(double *)(lVar10 + index_00) = dVar13;
    break;
  case TYPE_INT64:
    WasmArrayBoundsCheck<long>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(int64 *)(lVar10 + index_00) = iVar11;
    break;
  case TYPE_INT8_TO_INT64:
    WasmArrayBoundsCheck<char>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(char *)(lVar10 + index_00) = (char)iVar11;
    break;
  case TYPE_UINT8_TO_INT64:
    WasmArrayBoundsCheck<unsigned_char>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(char *)(lVar10 + index_00) = (char)iVar11;
    break;
  case TYPE_INT16_TO_INT64:
    WasmArrayBoundsCheck<short>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(short *)(lVar10 + index_00) = (short)iVar11;
    break;
  case TYPE_UINT16_TO_INT64:
    WasmArrayBoundsCheck<unsigned_short>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(short *)(lVar10 + index_00) = (short)iVar11;
    break;
  case TYPE_INT32_TO_INT64:
    WasmArrayBoundsCheck<int>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(int *)(lVar10 + index_00) = (int)iVar11;
    break;
  case TYPE_UINT32_TO_INT64:
    WasmArrayBoundsCheck<unsigned_int>(this,index_00,uVar5);
    iVar11 = GetRegRaw<long>(this,playout->Value);
    *(int *)(lVar10 + index_00) = (int)iVar11;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23b8,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  functionId = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(this + 0x88));
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmMemWritesPhase,sourceContextId,functionId);
  if (bVar3) {
    GetWebAssemblyMemory(this);
    pWVar8 = GetWebAssemblyMemory(this);
    uVar5 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
    WebAssemblyMemory::TraceMemWrite
              (pWVar8,uVar5,playout->Offset,playout->ViewType,(uint32)*(undefined8 *)(this + 0x108),
               *(ScriptContext **)(this + 0x78));
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_StArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            *(MemType*)(buffer + index) = (MemType)(GetRegRaw<RegType>(playout->Value)); \
            break;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
        CompileAssert(ArrayBufferView::ViewType::TYPE_COUNT == 15);
#if DBG
        if (PHASE_TRACE(WasmMemWritesPhase, m_functionBody))
        {
            GetWebAssemblyMemory()->TraceMemWrite(GetWebAssemblyMemory(), (uint32)GetRegRawInt(playout->SlotIndex), playout->Offset, playout->ViewType, (uint32)(size_t)this->DEBUG_currentByteOffset, scriptContext);
        }
#endif
        return;
#else
        Assert(UNREACHED);
#endif
    }